

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O2

void Cec3_AddClausesSuper(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Ptr_t *vSuper,bmcg_sat_solver *pSat)

{
  int iVar1;
  int iVar2;
  int *plits;
  void *pvVar3;
  long lVar4;
  int iVar5;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                  ,0xeb,
                  "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                 );
  }
  if (((int)(uint)*(undefined8 *)pNode < 0) ||
     (((uint)*(undefined8 *)pNode & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                  ,0xec,
                  "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                 );
  }
  iVar2 = vSuper->nSize;
  plits = (int *)malloc((long)iVar2 * 4 + 4);
  iVar5 = 0;
  while (iVar1 = vSuper->nSize, iVar5 < iVar1) {
    pvVar3 = Vec_PtrEntry(vSuper,iVar5);
    iVar1 = Cec3_ObjSatId(p,(Gia_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
    iVar1 = Abc_Var2Lit(iVar1,(uint)pvVar3 & 1);
    *plits = iVar1;
    iVar1 = Cec3_ObjSatId(p,pNode);
    iVar1 = Abc_Var2Lit(iVar1,1);
    plits[1] = iVar1;
    iVar1 = bmcg_sat_solver_addclause(pSat,plits,2);
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                    ,0xfc,
                    "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
                   );
    }
  }
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    pvVar3 = Vec_PtrEntry(vSuper,(int)lVar4);
    iVar5 = Cec3_ObjSatId(p,(Gia_Obj_t *)((ulong)pvVar3 & 0xfffffffffffffffe));
    iVar5 = Abc_Var2Lit(iVar5,~(uint)pvVar3 & 1);
    plits[lVar4] = iVar5;
    iVar1 = vSuper->nSize;
  }
  iVar5 = Cec3_ObjSatId(p,pNode);
  iVar5 = Abc_Var2Lit(iVar5,0);
  plits[iVar2] = iVar5;
  iVar2 = bmcg_sat_solver_addclause(pSat,plits,iVar2 + 1);
  if (iVar2 != 0) {
    free(plits);
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSatG.c"
                ,0x10d,
                "void Cec3_AddClausesSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Ptr_t *, bmcg_sat_solver *)"
               );
}

Assistant:

void Cec3_AddClausesSuper( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Ptr_t * vSuper, bmcg_sat_solver * pSat )
{
    int fPolarFlip = 0;
    Gia_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Gia_IsComplement(pNode) );
    assert( Gia_ObjIsAnd( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = Abc_Var2Lit(Cec3_ObjSatId(p, Gia_Regular(pFanin)), Gia_IsComplement(pFanin));
        pLits[1] = Abc_Var2Lit(Cec3_ObjSatId(p, pNode), 1);
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[0] = Abc_LitNot( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = Abc_LitNot( pLits[1] );
        }
        RetValue = bmcg_sat_solver_addclause( pSat, pLits, 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = Abc_Var2Lit(Cec3_ObjSatId(p, Gia_Regular(pFanin)), !Gia_IsComplement(pFanin));
        if ( fPolarFlip )
        {
            if ( Gia_Regular(pFanin)->fPhase )  pLits[i] = Abc_LitNot( pLits[i] );
        }
    }
    pLits[nLits-1] = Abc_Var2Lit(Cec3_ObjSatId(p, pNode), 0);
    if ( fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = Abc_LitNot( pLits[nLits-1] );
    }
    RetValue = bmcg_sat_solver_addclause( pSat, pLits, nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}